

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_7_channels_with_9_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float *pfVar83;
  long lVar84;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar83 = horizontal_coefficients + 8;
  do {
    lVar84 = (long)horizontal_contributors->n0;
    fVar12 = pfVar83[-8];
    fVar13 = pfVar83[-7];
    fVar14 = pfVar83[-6];
    fVar15 = pfVar83[-5];
    pfVar2 = decode_buffer + lVar84 * 7;
    fVar16 = *pfVar2;
    fVar17 = pfVar2[1];
    fVar18 = pfVar2[2];
    fVar19 = pfVar2[3];
    pfVar2 = decode_buffer + lVar84 * 7 + 3;
    fVar20 = pfVar2[1];
    fVar21 = pfVar2[2];
    fVar22 = pfVar2[3];
    pfVar3 = decode_buffer + lVar84 * 7 + 7;
    fVar23 = *pfVar3;
    fVar24 = pfVar3[1];
    fVar25 = pfVar3[2];
    fVar26 = pfVar3[3];
    pfVar3 = decode_buffer + lVar84 * 7 + 10;
    fVar27 = pfVar3[1];
    fVar28 = pfVar3[2];
    fVar29 = pfVar3[3];
    pfVar4 = decode_buffer + lVar84 * 7 + 0xe;
    fVar30 = *pfVar4;
    fVar31 = pfVar4[1];
    fVar32 = pfVar4[2];
    fVar33 = pfVar4[3];
    pfVar4 = decode_buffer + lVar84 * 7 + 0x11;
    fVar34 = pfVar4[1];
    fVar35 = pfVar4[2];
    fVar36 = pfVar4[3];
    pfVar5 = decode_buffer + lVar84 * 7 + 0x15;
    fVar37 = *pfVar5;
    fVar38 = pfVar5[1];
    fVar39 = pfVar5[2];
    fVar40 = pfVar5[3];
    pfVar5 = decode_buffer + lVar84 * 7 + 0x18;
    fVar41 = pfVar5[1];
    fVar42 = pfVar5[2];
    fVar43 = pfVar5[3];
    fVar44 = pfVar83[-4];
    fVar45 = pfVar83[-3];
    fVar46 = pfVar83[-2];
    fVar47 = pfVar83[-1];
    pfVar6 = decode_buffer + lVar84 * 7 + 0x1c;
    fVar48 = *pfVar6;
    fVar49 = pfVar6[1];
    fVar50 = pfVar6[2];
    fVar51 = pfVar6[3];
    pfVar6 = decode_buffer + lVar84 * 7 + 0x1f;
    fVar52 = pfVar6[1];
    fVar53 = pfVar6[2];
    fVar54 = pfVar6[3];
    pfVar7 = decode_buffer + lVar84 * 7 + 0x23;
    fVar55 = *pfVar7;
    fVar56 = pfVar7[1];
    fVar57 = pfVar7[2];
    fVar58 = pfVar7[3];
    pfVar7 = decode_buffer + lVar84 * 7 + 0x26;
    fVar59 = pfVar7[1];
    fVar60 = pfVar7[2];
    fVar61 = pfVar7[3];
    pfVar8 = decode_buffer + lVar84 * 7 + 0x2a;
    fVar62 = *pfVar8;
    fVar63 = pfVar8[1];
    fVar64 = pfVar8[2];
    fVar65 = pfVar8[3];
    pfVar8 = decode_buffer + lVar84 * 7 + 0x2d;
    fVar66 = pfVar8[1];
    fVar67 = pfVar8[2];
    fVar68 = pfVar8[3];
    pfVar9 = decode_buffer + lVar84 * 7 + 0x31;
    fVar69 = *pfVar9;
    fVar70 = pfVar9[1];
    fVar71 = pfVar9[2];
    fVar72 = pfVar9[3];
    pfVar9 = decode_buffer + lVar84 * 7 + 0x34;
    fVar73 = pfVar9[1];
    fVar74 = pfVar9[2];
    fVar75 = pfVar9[3];
    fVar11 = *pfVar83;
    pfVar10 = decode_buffer + lVar84 * 7 + 0x38;
    fVar76 = *pfVar10;
    fVar77 = pfVar10[1];
    fVar78 = pfVar10[2];
    fVar79 = pfVar10[3];
    pfVar10 = decode_buffer + lVar84 * 7 + 0x3b;
    fVar80 = pfVar10[1];
    fVar81 = pfVar10[2];
    fVar82 = pfVar10[3];
    output_buffer[3] =
         *pfVar10 * fVar11 +
         *pfVar8 * fVar46 + *pfVar6 * fVar44 + *pfVar4 * fVar14 + *pfVar2 * fVar12 +
         *pfVar9 * fVar47 + fVar45 * *pfVar7 + *pfVar5 * fVar15 + fVar13 * *pfVar3;
    output_buffer[4] =
         fVar80 * fVar11 + fVar66 * fVar46 + fVar52 * fVar44 + fVar34 * fVar14 + fVar20 * fVar12 +
         fVar73 * fVar47 + fVar45 * fVar59 + fVar41 * fVar15 + fVar13 * fVar27;
    output_buffer[5] =
         fVar81 * fVar11 + fVar67 * fVar46 + fVar53 * fVar44 + fVar35 * fVar14 + fVar21 * fVar12 +
         fVar74 * fVar47 + fVar45 * fVar60 + fVar42 * fVar15 + fVar13 * fVar28;
    output_buffer[6] =
         fVar82 * fVar11 + fVar68 * fVar46 + fVar54 * fVar44 + fVar36 * fVar14 + fVar22 * fVar12 +
         fVar75 * fVar47 + fVar45 * fVar61 + fVar43 * fVar15 + fVar13 * fVar29;
    *output_buffer =
         fVar76 * fVar11 + fVar62 * fVar46 + fVar48 * fVar44 + fVar30 * fVar14 + fVar16 * fVar12 +
         fVar69 * fVar47 + fVar55 * fVar45 + fVar37 * fVar15 + fVar23 * fVar13;
    output_buffer[1] =
         fVar77 * fVar11 + fVar63 * fVar46 + fVar49 * fVar44 + fVar31 * fVar14 + fVar17 * fVar12 +
         fVar70 * fVar47 + fVar56 * fVar45 + fVar38 * fVar15 + fVar24 * fVar13;
    output_buffer[2] =
         fVar78 * fVar11 + fVar64 * fVar46 + fVar50 * fVar44 + fVar32 * fVar14 + fVar18 * fVar12 +
         fVar71 * fVar47 + fVar57 * fVar45 + fVar39 * fVar15 + fVar25 * fVar13;
    output_buffer[3] =
         fVar79 * fVar11 + fVar65 * fVar46 + fVar51 * fVar44 + fVar33 * fVar14 + fVar19 * fVar12 +
         fVar72 * fVar47 + fVar58 * fVar45 + fVar40 * fVar15 + fVar26 * fVar13;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar83 = pfVar83 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_9_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__1_coeff_remnant(8);
    stbir__store_output();
  } while ( output < output_end );
}